

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sph.cpp
# Opt level: O1

void sph_solve<FNV1A64x8>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keywords)

{
  undefined1 uVar1;
  byte bVar2;
  uint c;
  ulong uVar3;
  void *__s;
  long lVar4;
  result_type rVar5;
  uint uVar6;
  uint i;
  ulong uVar7;
  ulong uVar8;
  pointer pbVar9;
  value_type_conflict1 *__val;
  KHType KVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  permutedKeywords;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mixtable;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  FNV1A64x8 hasher;
  uniform_int_distribution<unsigned_long> udist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  int local_70;
  uint local_6c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  FNV1A64x8 local_50;
  ulong local_48;
  uniform_int_distribution<unsigned_long> local_40;
  
  local_50.name = "FNV1A64x8";
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,
           (long)(keywords->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(keywords->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,
             (long)(keywords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(keywords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_88);
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_88,(long)mixersize);
  if (-1 < (long)permutesize) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&local_a0,(long)permutesize);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_68,(long)permutesize);
  }
  uVar3 = (long)(keywords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(keywords->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = uVar3 >> 5;
  if ((uVar7 & 0xffffffff) < (ulong)((long)uVar3 >> 4)) {
    uVar3 = uVar7 & 0xffffffff;
    do {
      if (permutesize == -1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&local_a0,uVar3);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_68,uVar3);
      }
      __s = operator_new(0x100);
      memset(__s,0,0x100);
      lVar4 = 0;
      do {
        *(char *)((long)__s + lVar4) = (char)lVar4;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x100);
      local_40._M_param._M_a = 0;
      local_40._M_param._M_b = 0xff;
      local_48 = uVar7;
      if (maxiter == 0) {
        uVar6 = 1;
        uVar3 = 0;
      }
      else {
        uVar3 = 0;
        uVar6 = 0x101;
        do {
          local_6c = uVar6;
          lVar4 = 0;
          do {
            rVar5 = std::uniform_int_distribution<unsigned_long>::operator()
                              (&local_40,&rng,&local_40._M_param);
            uVar1 = *(undefined1 *)((long)__s + lVar4);
            *(undefined1 *)((long)__s + lVar4) = *(undefined1 *)((long)__s + rVar5);
            *(undefined1 *)((long)__s + rVar5) = uVar1;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 0x100);
          if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar6 = 1;
            uVar7 = 0;
            do {
              local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] = *(uchar *)((long)__s + uVar7);
              uVar7 = (ulong)uVar6;
              uVar6 = uVar6 + 1;
            } while (uVar7 < (ulong)((long)local_88.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_88.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start));
          }
          if (local_a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar6 = 1;
            uVar7 = 0;
            do {
              local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] = 0;
              local_a0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_string_length = 0;
              *local_a0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p = '\0';
              uVar7 = (ulong)uVar6;
              uVar6 = uVar6 + 1;
            } while (uVar7 < (ulong)((long)local_a0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_a0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          local_70 = (int)uVar3;
          pbVar9 = (keywords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((keywords->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish == pbVar9) {
            uVar3 = 0;
          }
          else {
            uVar7 = 1;
            uVar3 = 0;
            do {
              uVar8 = uVar7;
              KVar10 = FNV1A64x8::operator()
                                 (&local_50,pbVar9 + uVar3,&local_88,
                                  (long)local_a0.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_a0.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5);
              bVar2 = KVar10.key;
              if (local_a0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[bVar2]._M_string_length != 0) break;
              local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[bVar2] = KVar10.hash;
              std::__cxx11::string::_M_assign
                        ((string *)
                         (local_a0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + bVar2));
              pbVar9 = (keywords->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar7 = (ulong)((int)uVar8 + 1);
              uVar3 = uVar8;
            } while (uVar8 < (ulong)((long)(keywords->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pbVar9 >> 5));
          }
          uVar6 = local_6c & 0xff;
          if ((long)(keywords->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(keywords->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5 == uVar3) {
            uVar6 = 0;
          }
          uVar3 = (ulong)(local_70 + 1U);
        } while ((local_70 + 1U < (uint)maxiter) && ((uVar6 & 1) != 0));
      }
      if ((uVar6 & 1) == 0) {
        printf("%s solution for %lu keywords using a %lu keyword table (%u iterations)\n",
               local_50.name,
               (long)(keywords->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(keywords->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5,
               (long)local_a0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5,uVar3);
        sph_soln<FNV1A64x8>(keywords,&local_88,&local_a0,&local_68);
        operator_delete(__s,0x100);
        goto LAB_001039a1;
      }
      operator_delete(__s,0x100);
      uVar7 = (ulong)((int)local_48 + 1);
      uVar3 = uVar7;
    } while (uVar7 < (ulong)((long)(keywords->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(keywords->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  puts("Failure!");
LAB_001039a1:
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  return;
}

Assistant:

void sph_solve(vector<string> &keywords)
{
    T hasher;
    vector<string> permutedKeywords(keywords.size());
    vector<typename T::Hash> hashes(keywords.size());
    vector<typename T::Key> mixtable;
    uint keysize = 1 << (sizeof(typename T::Key) * 8);

    mixtable.resize(mixersize); // must be ^2 and <= keysize

    uint iterations = 0;

    if (permutesize > -1)
    {
        permutedKeywords.resize(permutesize);
        hashes.resize(permutesize);
    }

    for(uint i = keywords.size(); i < keywords.size() * 2; i++)
    {
        if (permutesize == -1)
        {
            // if there are collisions, try a progressively larger keyword table
            permutedKeywords.resize(i);
            hashes.resize(i);
        }
        vector<typename T::Key> srcTable(keysize );
        for(uint c = 0; c < keysize; c++ )
            srcTable[ c ] = c;

        std::uniform_int_distribution<rng_type::result_type> udist(0, srcTable.size() -1);

        // mixtable retry loop...
        bool collision = true; // default assumption
        iterations = 0;
        while((iterations < maxiter) && collision)
        {
            // permute the srcTable and build mixtable and clear the hash stats
            for( uint i = 0; i < srcTable.size(); i++ )
                std::swap(srcTable[i], srcTable[ udist(rng) ]);
            for( uint i = 0; i < mixtable.size(); i++ )
                mixtable[i] = srcTable[i];
            for( uint pk = 0; pk < permutedKeywords.size(); pk++ )
            { hashes[pk] = 0; permutedKeywords[pk].clear(); }

            // trial hash all keywords. check for collisions
            uint k = 0;
            for( k = 0; k < keywords.size(); k++ )
            {
                auto kh = hasher(keywords[k], mixtable, permutedKeywords.size());
                if( permutedKeywords[ kh.key ].length() > 0 )
                    break; // collision
                hashes[ kh.key ] = kh.hash;
                permutedKeywords[ kh.key ] = keywords[ k ];
            }
            if( k == keywords.size() )
                collision = false; // no collisions
            iterations++;
        }
        if (!collision)
        {
            printf("%s solution for %lu keywords using a %lu keyword table (%u iterations)\n", hasher.name, keywords.size(), permutedKeywords.size(), iterations);
            sph_soln<T>(keywords, mixtable, permutedKeywords, hashes);
            return;
        }
    }
    printf("Failure!\n");
}